

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O0

void __thiscall
tcu::x11::glx::GlxDisplay::GlxDisplay(GlxDisplay *this,EventState *eventState,char *name)

{
  int iVar1;
  undefined4 uVar2;
  NotSupportedError *this_00;
  char *pcVar3;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_278;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_248;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  allocator<char> local_1e1;
  string local_1e0 [32];
  istringstream local_1c0 [8];
  istringstream extStream;
  char *extensions;
  int screen;
  int supported;
  char *name_local;
  EventState *eventState_local;
  GlxDisplay *this_local;
  
  XlibDisplay::XlibDisplay(&this->super_XlibDisplay,eventState,name);
  (this->super_XlibDisplay).super_DisplayBase._vptr_DisplayBase =
       (_func_int **)&PTR__GlxDisplay_03218ab0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->m_extensions);
  iVar1 = glXQueryExtension((this->super_XlibDisplay).m_display,&this->m_errorBase,
                            &this->m_eventBase);
  if (iVar1 == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    NotSupportedError::NotSupportedError
              (this_00,"GLX protocol not supported by X server",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
               ,0xe4);
    __cxa_throw(this_00,&NotSupportedError::typeinfo,NotSupportedError::~NotSupportedError);
  }
  iVar1 = glXQueryVersion((this->super_XlibDisplay).m_display,&this->m_majorVersion,
                          &this->m_minorVersion);
  checkGLX<int>(iVar1,"glXQueryVersion(m_display, &m_majorVersion, &m_minorVersion)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
                ,0xe6);
  uVar2 = XDefaultScreen((this->super_XlibDisplay).m_display);
  pcVar3 = (char *)glXQueryServerString((this->super_XlibDisplay).m_display,uVar2,3);
  pcVar3 = checkGLX<char_const*>
                     (pcVar3,"glXQueryServerString(m_display, screen, GLX_EXTENSIONS)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
                      ,0xed);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,pcVar3,&local_1e1);
  std::__cxx11::istringstream::istringstream(local_1c0,local_1e0,_S_in);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator(&local_248,(istream_type *)local_1c0);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator(&local_278);
  std::
  set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
  set<std::istream_iterator<std::__cxx11::string,char,std::char_traits<char>,long>>
            ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_218,&local_248,&local_278);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->m_extensions,&local_218);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&local_218);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::~istream_iterator(&local_278);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::~istream_iterator(&local_248);
  std::__cxx11::istringstream::~istringstream(local_1c0);
  return;
}

Assistant:

GlxDisplay::GlxDisplay (EventState& eventState, const char* name)
	: XlibDisplay	(eventState, name)
{
	const Bool supported = glXQueryExtension(m_display, &m_errorBase, &m_eventBase);
	if (!supported)
		TCU_THROW(NotSupportedError, "GLX protocol not supported by X server");

	TCU_CHECK_GLX(glXQueryVersion(m_display, &m_majorVersion, &m_minorVersion));

	{
		const int screen = XDefaultScreen(m_display);
		// nVidia doesn't seem to report client-side extensions correctly,
		// so only use server side
		const char* const extensions =
			TCU_CHECK_GLX(glXQueryServerString(m_display, screen, GLX_EXTENSIONS));
		istringstream extStream(extensions);
		m_extensions = set<string>(istream_iterator<string>(extStream),
								   istream_iterator<string>());
	}
}